

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_irExpression * build_ir_convert(Context_conflict *ctx,MOJOSHADER_astExpressionCast *ast)

{
  int iVar1;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *pMVar2;
  MOJOSHADER_irNode *pMVar3;
  MOJOSHADER_irExpression *pMVar4;
  MOJOSHADER_astDataTypeType MVar5;
  
  dt = reduce_datatype(ctx,ast->datatype);
  pMVar2 = reduce_datatype(ctx,dt);
  MVar5 = pMVar2->type;
  if (MVar5 - MOJOSHADER_AST_DATATYPE_ARRAY < 4) {
    MVar5 = ((pMVar2->array).base)->type;
  }
  iVar1 = datatype_elems(ctx,dt);
  pMVar3 = build_ir(ctx,ast->operand);
  if (pMVar3 != (MOJOSHADER_irNode *)0x0) {
    if ((pMVar3->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) {
      __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ec,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
    if (MOJOSHADER_IR_CONSTRUCT < (pMVar3->ir).type) {
      __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ed,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
  }
  pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
  if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar4->ir).type = MOJOSHADER_IR_CONVERT;
    (pMVar4->ir).filename = ctx->sourcefile;
    (pMVar4->ir).line = ctx->sourceline;
    (pMVar4->info).type = MVar5;
    (pMVar4->info).elements = iVar1;
    (pMVar4->eseq).stmt = (MOJOSHADER_irStatement *)pMVar3;
  }
  return pMVar4;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_convert(Context *ctx, const MOJOSHADER_astExpressionCast *ast)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->datatype);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    return new_ir_convert(ctx, build_ir_expr(ctx, ast->operand), type, elems);
}